

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O2

GeneratedMessageFactory * google::protobuf::anon_unknown_0::GeneratedMessageFactory::singleton(void)

{
  int iVar1;
  GeneratedMessageFactory *arg;
  
  if ((anonymous_namespace)::GeneratedMessageFactory::singleton()::instance == '\0') {
    iVar1 = __cxa_guard_acquire(&(anonymous_namespace)::GeneratedMessageFactory::singleton()::
                                 instance);
    if (iVar1 != 0) {
      arg = (GeneratedMessageFactory *)operator_new(0xa0);
      (arg->super_MessageFactory)._vptr_MessageFactory =
           (_func_int **)&PTR__GeneratedMessageFactory_0060dd30;
      (arg->file_map_)._M_h._M_buckets = &(arg->file_map_)._M_h._M_single_bucket;
      (arg->file_map_)._M_h._M_bucket_count = 1;
      (arg->file_map_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      (arg->file_map_)._M_h._M_element_count = 0;
      (arg->file_map_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      (arg->file_map_)._M_h._M_rehash_policy._M_next_resize = 0;
      (arg->file_map_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
      (arg->mutex_).mu_.super___mutex_base._M_mutex.__align = 0;
      *(undefined8 *)((long)&(arg->mutex_).mu_.super___mutex_base._M_mutex + 8) = 0;
      *(undefined8 *)((long)&(arg->mutex_).mu_.super___mutex_base._M_mutex + 0x10) = 0;
      (arg->mutex_).mu_.super___mutex_base._M_mutex.__data.__list.__prev =
           (__pthread_internal_list *)0x0;
      (arg->mutex_).mu_.super___mutex_base._M_mutex.__data.__list.__next =
           (__pthread_internal_list *)0x0;
      (arg->type_map_)._M_h._M_buckets = &(arg->type_map_)._M_h._M_single_bucket;
      (arg->type_map_)._M_h._M_bucket_count = 1;
      (arg->type_map_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      (arg->type_map_)._M_h._M_element_count = 0;
      (arg->type_map_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      (arg->type_map_)._M_h._M_rehash_policy._M_next_resize = 0;
      (arg->type_map_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
      internal::OnShutdownRun
                (internal::
                 OnShutdownDelete<google::protobuf::(anonymous_namespace)::GeneratedMessageFactory>
                 ::anon_class_1_0_00000001::__invoke,arg);
      singleton::instance = arg;
      __cxa_guard_release(&(anonymous_namespace)::GeneratedMessageFactory::singleton()::instance);
    }
  }
  return singleton::instance;
}

Assistant:

GeneratedMessageFactory* GeneratedMessageFactory::singleton() {
  static auto instance =
      internal::OnShutdownDelete(new GeneratedMessageFactory);
  return instance;
}